

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_index.c
# Opt level: O1

int cram_index_load(cram_fd *fd,char *fn)

{
  byte *pbVar1;
  char cVar2;
  int iVar3;
  cram_fd *pcVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  cram_index *pcVar9;
  hFILE *fp;
  long lVar10;
  char *pcVar11;
  undefined8 *puVar12;
  cram_index *pcVar13;
  undefined8 *__ptr;
  ulong uVar14;
  size_t sVar15;
  int iVar16;
  size_t sVar17;
  size_t __size;
  char *pcVar18;
  ulong uVar19;
  bool bVar20;
  size_t l;
  char fn2 [4096];
  char buf [65536];
  kstring_t kStack_110a8;
  undefined8 *puStack_11090;
  size_t sStack_11088;
  cram_index *pcStack_11080;
  size_t asStack_11078 [2];
  int iStack_11068;
  int iStack_11064;
  int iStack_11060;
  undefined4 uStack_1105c;
  undefined8 uStack_11058;
  long lStack_11050;
  cram_fd *pcStack_11040;
  char acStack_11038 [4096];
  undefined1 auStack_10038 [65544];
  
  kStack_110a8.s = (char *)0x0;
  kStack_110a8.l = 0;
  kStack_110a8.m = 0;
  sStack_11088 = 0;
  if (fd->index != (cram_index *)0x0) {
    return 0;
  }
  fd->index_sz = 1;
  pcVar9 = (cram_index *)calloc(1,0x30);
  fd->index = pcVar9;
  if (pcVar9 == (cram_index *)0x0) {
    return -1;
  }
  pcVar9->refid = -1;
  pcVar9->start = -0x80000000;
  pcVar9->end = 0x7fffffff;
  puStack_11090 = (undefined8 *)calloc(1,8);
  *puStack_11090 = pcVar9;
  sprintf(acStack_11038,"%s.crai",fn);
  fp = hopen(acStack_11038,"r");
  __size = kStack_110a8.m;
  uVar14 = kStack_110a8.l;
  pcVar18 = kStack_110a8.s;
  pcVar4 = fd;
  if (fp != (hFILE *)0x0) {
LAB_00150975:
    pcStack_11040 = pcVar4;
    pcStack_11080 = pcVar9;
    uVar19 = (long)fp->end - (long)fp->begin;
    sVar17 = 0x10000;
    if (uVar19 < 0x10000) {
      sVar17 = uVar19;
    }
    memcpy(auStack_10038,fp->begin,sVar17);
    fp->begin = fp->begin + sVar17;
    lVar10 = 0x10000;
    if (uVar19 < 0x10000) {
      lVar10 = hread2(fp,auStack_10038,0x10000,sVar17);
    }
    if (0 < lVar10) {
      sVar17 = (size_t)(int)lVar10;
      uVar19 = sVar17 + uVar14 + 1;
      pcVar11 = pcVar18;
      if (__size <= uVar19) goto code_r0x001509df;
      goto LAB_00150a2a;
    }
    kStack_110a8.l = uVar14;
    kStack_110a8.m = __size;
    kStack_110a8.s = pcVar18;
    if (uVar14 < 2 || lVar10 != 0) {
      __ptr = puStack_11090;
      if (pcVar18 != (char *)0x0) {
        free(pcVar18);
        __ptr = puStack_11090;
      }
    }
    else {
      iVar5 = hclose(fp);
      __ptr = puStack_11090;
      pcVar18 = kStack_110a8.s;
      if (iVar5 != 0) {
        if (kStack_110a8.s != (char *)0x0) {
          free(kStack_110a8.s);
        }
        goto LAB_00150aaf;
      }
      if ((*kStack_110a8.s == '\x1f') && (kStack_110a8.s[1] == -0x75)) {
        pcVar11 = zlib_mem_inflate(kStack_110a8.s,uVar14,asStack_11078);
        free(pcVar18);
        if (pcVar11 == (char *)0x0) {
          free(__ptr);
          return -1;
        }
        kStack_110a8.l = asStack_11078[0];
        kStack_110a8.m = asStack_11078[0];
        kStack_110a8.s = pcVar11;
        kputsn("",0,&kStack_110a8);
      }
      iVar16 = 0;
      iVar5 = 1;
      pcVar9 = pcStack_11080;
      while( true ) {
        iVar6 = kget_int32(&kStack_110a8,&sStack_11088,&iStack_11068);
        if (((iVar6 == -1) ||
            (iVar6 = kget_int32(&kStack_110a8,&sStack_11088,&iStack_11064), iVar6 == -1)) ||
           (iVar6 = kget_int32(&kStack_110a8,&sStack_11088,&iStack_11060), iVar6 == -1)) break;
        uVar14 = 1;
        sVar15 = sStack_11088;
        if (sStack_11088 < kStack_110a8.l) {
          lVar10 = -sStack_11088;
          bVar20 = true;
          uVar19 = sStack_11088;
          do {
            cVar2 = kStack_110a8.s[uVar19];
            if ((cVar2 != ' ') && (cVar2 != '\t')) {
              if (bVar20) {
                uVar14 = -(ulong)(cVar2 == '-') | 1;
                sVar15 = (ulong)(cVar2 == '-') - lVar10;
              }
              else {
                sVar15 = -lVar10;
              }
              break;
            }
            bVar20 = uVar19 + 1 < kStack_110a8.l;
            lVar10 = lVar10 + -1;
            sVar15 = kStack_110a8.l;
            uVar19 = uVar19 + 1;
          } while (kStack_110a8.l + lVar10 != 0);
        }
        if ((kStack_110a8.l <= sVar15) || (9 < (byte)(kStack_110a8.s[sVar15] - 0x30U))) break;
        lStack_11050 = 0;
        do {
          pbVar1 = (byte *)(kStack_110a8.s + sVar15);
          sStack_11088 = sVar15;
          if (9 < (byte)(*pbVar1 - 0x30)) break;
          sVar15 = sVar15 + 1;
          lStack_11050 = (ulong)*pbVar1 + lStack_11050 * 10 + -0x30;
          sStack_11088 = kStack_110a8.l;
        } while (kStack_110a8.l != sVar15);
        lStack_11050 = lStack_11050 * uVar14;
        iVar6 = kget_int32(&kStack_110a8,&sStack_11088,(int32_t *)&uStack_11058);
        if ((iVar6 == -1) ||
           (iVar7 = kget_int32(&kStack_110a8,&sStack_11088,(int32_t *)((long)&uStack_11058 + 4)),
           pcVar4 = pcStack_11040, iVar3 = iStack_11064, iVar6 = iStack_11068, iVar7 == -1)) break;
        pcStack_11080 = (cram_index *)CONCAT44(pcStack_11080._4_4_,iVar5);
        iVar5 = iStack_11064 + iStack_11060 + -1;
        lVar10 = (long)iStack_11068;
        iStack_11060 = iVar5;
        if (lVar10 < -1) {
          cram_index_load_cold_1();
          return -1;
        }
        if (iStack_11068 != pcVar9->refid) {
          iVar16 = pcStack_11040->index_sz;
          uVar8 = iStack_11068 + 2;
          puStack_11090 = __ptr;
          if (iVar16 < (int)uVar8) {
            pcStack_11040->index_sz = uVar8;
            pcVar9 = (cram_index *)realloc(pcStack_11040->index,(ulong)uVar8 * 0x30);
            pcVar4->index = pcVar9;
            memset(pcVar9 + iVar16,0,((long)pcVar4->index_sz - (long)iVar16) * 0x30);
          }
          pcVar13 = pcVar4->index;
          pcVar9 = pcVar13 + lVar10 + 1;
          pcVar13[lVar10 + 1].refid = iVar6;
          pcVar13[lVar10 + 1].start = -0x80000000;
          pcVar13[lVar10 + 1].end = 0x7fffffff;
          pcVar9->nslice = 0;
          pcVar9->nalloc = 0;
          pcVar13[lVar10 + 1].e = (cram_index *)0x0;
          *puStack_11090 = pcVar9;
          iVar16 = 0;
          __ptr = puStack_11090;
        }
        lVar10 = (long)iVar16;
        iVar16 = iVar16 + 1;
        puVar12 = __ptr + lVar10 + -1;
        while ((iVar3 < pcVar9->start || (pcVar9->end < iVar5))) {
          iVar16 = iVar16 + -1;
          pcVar9 = (cram_index *)*puVar12;
          puVar12 = puVar12 + -1;
        }
        iVar5 = pcVar9->nalloc;
        if (iVar5 <= pcVar9->nslice + 1) {
          iVar6 = iVar5 * 2;
          if (iVar5 == 0) {
            iVar6 = 0x10;
          }
          pcVar9->nalloc = iVar6;
          pcVar13 = (cram_index *)realloc(pcVar9->e,(long)iVar6 * 0x30);
          pcVar9->e = pcVar13;
        }
        asStack_11078[0] = 0;
        asStack_11078[1] = 0;
        pcVar13 = pcVar9->e;
        iVar6 = pcVar9->nslice;
        pcVar9->nslice = iVar6 + 1;
        pcVar9 = pcVar13 + iVar6;
        pcVar9->slice = (undefined4)uStack_11058;
        pcVar9->len = uStack_11058._4_4_;
        *(long *)(&pcVar9->slice + 2) = lStack_11050;
        pcVar9 = pcVar13 + iVar6;
        pcVar9->refid = iStack_11068;
        pcVar9->start = iStack_11064;
        *(ulong *)(&pcVar9->refid + 2) = CONCAT44(uStack_1105c,iStack_11060);
        pcVar9 = pcVar13 + iVar6;
        pcVar9->nslice = 0;
        pcVar9->nalloc = 0;
        pcVar9->e = (cram_index *)0x0;
        iVar5 = (int)pcStack_11080;
        if ((int)pcStack_11080 <= iVar16) {
          iVar5 = (int)pcStack_11080 * 2;
          __ptr = (undefined8 *)realloc(__ptr,(long)iVar5 << 3);
        }
        pcVar9 = pcVar13 + iVar6;
        __ptr[iVar16] = pcVar9;
        uVar14 = sStack_11088;
        if (sStack_11088 < kStack_110a8.l) {
          do {
            sStack_11088 = uVar14;
            if (kStack_110a8.s[sStack_11088] == '\n') break;
            uVar14 = sStack_11088 + 1;
            sStack_11088 = kStack_110a8.l;
          } while (kStack_110a8.l != uVar14);
        }
        sStack_11088 = sStack_11088 + 1;
        if (kStack_110a8.l <= sStack_11088) {
          free(__ptr);
          free(kStack_110a8.s);
          return 0;
        }
      }
      free(kStack_110a8.s);
    }
    free(__ptr);
    return -1;
  }
  perror(acStack_11038);
  __ptr = puStack_11090;
LAB_00150aaf:
  free(__ptr);
  return -1;
code_r0x001509df:
  uVar19 = uVar19 >> 1 | uVar19;
  uVar19 = uVar19 >> 2 | uVar19;
  uVar19 = uVar19 >> 4 | uVar19;
  uVar19 = uVar19 >> 8 | uVar19;
  __size = (uVar19 >> 0x10 | uVar19) + 1;
  pcVar11 = (char *)realloc(pcVar18,__size);
  pcVar9 = pcStack_11080;
  pcVar4 = pcStack_11040;
  if (pcVar11 != (char *)0x0) {
LAB_00150a2a:
    memcpy(pcVar11 + uVar14,auStack_10038,sVar17);
    pcVar11[uVar14 + sVar17] = '\0';
    uVar14 = uVar14 + sVar17;
    pcVar18 = pcVar11;
    pcVar9 = pcStack_11080;
    pcVar4 = pcStack_11040;
  }
  goto LAB_00150975;
}

Assistant:

int cram_index_load(cram_fd *fd, const char *fn) {
    char fn2[PATH_MAX];
    char buf[65536];
    ssize_t len;
    kstring_t kstr = {0};
    hFILE *fp;
    cram_index *idx;
    cram_index **idx_stack = NULL, *ep, e;
    int idx_stack_alloc = 0, idx_stack_ptr = 0;
    size_t pos = 0;

    /* Check if already loaded */
    if (fd->index)
	return 0;

    fd->index = calloc((fd->index_sz = 1), sizeof(*fd->index));
    if (!fd->index)
	return -1;

    idx = &fd->index[0];
    idx->refid = -1;
    idx->start = INT_MIN;
    idx->end   = INT_MAX;

    idx_stack = calloc(++idx_stack_alloc, sizeof(*idx_stack));
    idx_stack[idx_stack_ptr] = idx;

    sprintf(fn2, "%s.crai", fn);
    if (!(fp = hopen(fn2, "r"))) {
	perror(fn2);
	free(idx_stack);
	return -1; 
    }

    // Load the file into memory
    while ((len = hread(fp, buf, 65536)) > 0)
	kputsn(buf, len, &kstr);
    if (len < 0 || kstr.l < 2) {
	if (kstr.s)
	    free(kstr.s);
	free(idx_stack);
	return -1;
    }

    if (hclose(fp)) {
	if (kstr.s)
	    free(kstr.s);
	free(idx_stack);
	return -1;
    }
	

    // Uncompress if required
    if (kstr.s[0] == 31 && (uc)kstr.s[1] == 139) {
	size_t l;
	char *s = zlib_mem_inflate(kstr.s, kstr.l, &l);
	free(kstr.s);
	if (!s) {
	    free(idx_stack);
	    return -1;
	}
	kstr.s = s;
	kstr.l = l;
	kstr.m = l; // conservative estimate of the size allocated
	kputsn("", 0, &kstr); // ensure kstr.s is NUL-terminated
    }


    // Parse it line at a time
    do {
	/* 1.1 layout */
	if (kget_int32(&kstr, &pos, &e.refid) == -1) {
	    free(kstr.s); free(idx_stack); return -1;
	}
	if (kget_int32(&kstr, &pos, &e.start) == -1) {
	    free(kstr.s); free(idx_stack); return -1;
	}
	if (kget_int32(&kstr, &pos, &e.end) == -1) {
	    free(kstr.s); free(idx_stack); return -1;
	}
	if (kget_int64(&kstr, &pos, &e.offset) == -1) {
	    free(kstr.s); free(idx_stack); return -1;
	}
	if (kget_int32(&kstr, &pos, &e.slice) == -1) {
	    free(kstr.s); free(idx_stack); return -1;
	}
	if (kget_int32(&kstr, &pos, &e.len) == -1) {
	    free(kstr.s); free(idx_stack); return -1;
	}

	e.end += e.start-1;
	//printf("%d/%d..%d\n", e.refid, e.start, e.end);

	if (e.refid < -1) {
	    free(kstr.s);
	    free(idx_stack);
	    fprintf(stderr, "Malformed index file, refid %d\n", e.refid);
	    return -1;
	}

	if (e.refid != idx->refid) {
	    if (fd->index_sz < e.refid+2) {
		size_t index_end = fd->index_sz * sizeof(*fd->index);
		fd->index_sz = e.refid+2;
		fd->index = realloc(fd->index,
				    fd->index_sz * sizeof(*fd->index));
		memset(((char *)fd->index) + index_end, 0,
		       fd->index_sz * sizeof(*fd->index) - index_end);
	    }
	    idx = &fd->index[e.refid+1];
	    idx->refid = e.refid;
	    idx->start = INT_MIN;
	    idx->end   = INT_MAX;
	    idx->nslice = idx->nalloc = 0;
	    idx->e = NULL;
	    idx_stack[(idx_stack_ptr = 0)] = idx;
	}

	while (!(e.start >= idx->start && e.end <= idx->end)) {
	    idx = idx_stack[--idx_stack_ptr];
	}

	// Now contains, so append
	if (idx->nslice+1 >= idx->nalloc) {
	    idx->nalloc = idx->nalloc ? idx->nalloc*2 : 16;
	    idx->e = realloc(idx->e, idx->nalloc * sizeof(*idx->e));
	}

	e.nalloc = e.nslice = 0; e.e = NULL;
	*(ep = &idx->e[idx->nslice++]) = e;
	idx = ep;

	if (++idx_stack_ptr >= idx_stack_alloc) {
	    idx_stack_alloc *= 2;
	    idx_stack = realloc(idx_stack, idx_stack_alloc*sizeof(*idx_stack));
	}
	idx_stack[idx_stack_ptr] = idx;

	while (pos < kstr.l && kstr.s[pos] != '\n')
	    pos++;
	pos++;
    } while (pos < kstr.l);

    free(idx_stack);
    free(kstr.s);

    // dump_index(fd);

    return 0;
}